

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnInitExprI64ConstExpr
          (BinaryReaderIR *this,Index index,uint64_t value)

{
  intrusive_list<wabt::Expr> *this_00;
  Const local_a0;
  unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> local_58;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_50;
  undefined1 local_48 [8];
  Location loc;
  uint64_t value_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  loc.field_1._8_8_ = value;
  GetLocation((Location *)local_48,this);
  this_00 = this->current_init_expr_;
  Const::I64(&local_a0,loc.field_1._8_8_,(Location *)local_48);
  MakeUnique<wabt::ConstExpr,wabt::Const,wabt::Location&>
            ((wabt *)&local_58,&local_a0,(Location *)local_48);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_50,&local_58);
  intrusive_list<wabt::Expr>::push_back(this_00,&local_50);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_50);
  std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr(&local_58);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnInitExprI64ConstExpr(Index index, uint64_t value) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<ConstExpr>(Const::I64(value, loc), loc));
  return Result::Ok;
}